

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream.c
# Opt level: O0

log_policy_interface log_policy_stream(log_policy_id policy_stream_id)

{
  log_policy_interface plVar1;
  long in_RDI;
  
  plVar1 = (*log_policy_stream::policy_stream_singleton[in_RDI])();
  return plVar1;
}

Assistant:

log_policy_interface log_policy_stream(const log_policy_id policy_stream_id)
{
	static const log_policy_singleton policy_stream_singleton[LOG_POLICY_STREAM_SIZE] = {
		&log_policy_stream_file_interface,
		&log_policy_stream_nginx_interface,
		&log_policy_stream_socket_interface,
		&log_policy_stream_stdio_interface,
		&log_policy_stream_syslog_interface,
		&log_policy_stream_custom_interface
	};

	return policy_stream_singleton[policy_stream_id]();
}